

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O1

void __thiscall duckdb::Linenoise::RefreshSearch(Linenoise *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer pcVar3;
  pointer psVar4;
  int iVar5;
  char cVar6;
  bool bVar7;
  long *plVar8;
  size_t sVar9;
  size_t sVar10;
  char *__s;
  size_t sVar11;
  size_type *psVar12;
  size_t *psVar13;
  ulong uVar14;
  long lVar15;
  char cVar16;
  Linenoise *pLVar17;
  Linenoise *pLVar18;
  ulong uVar19;
  ulong uVar20;
  byte bVar21;
  searchMatch *in_stack_fffffffffffffe58;
  string highlight_buffer;
  string matches_text;
  string search_prompt;
  string no_matches_text;
  size_t search_render_pos;
  size_t search_len;
  char *search_buf;
  string __str;
  Linenoise clone;
  
  bVar21 = 0;
  search_prompt._M_dataplus._M_p = (pointer)&search_prompt.field_2;
  search_prompt._M_string_length = 0;
  search_prompt.field_2._M_local_buf[0] = '\0';
  no_matches_text._M_dataplus._M_p = (pointer)&no_matches_text.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&no_matches_text,"(no matches)","");
  uVar2 = this->search_index;
  uVar19 = ((long)(this->search_matches).
                  super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->search_matches).
                  super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if ((this->search_buf)._M_string_length == 0) {
    highlight_buffer._M_dataplus._M_p = (pointer)&highlight_buffer.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&highlight_buffer,'\x14');
    plVar8 = (long *)::std::__cxx11::string::replace
                               ((ulong)&highlight_buffer,0,(char *)0x0,0x12d8b62);
    psVar12 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar12) {
      matches_text.field_2._M_allocated_capacity = *psVar12;
      matches_text.field_2._8_8_ = plVar8[3];
      matches_text._M_dataplus._M_p = (pointer)&matches_text.field_2;
    }
    else {
      matches_text.field_2._M_allocated_capacity = *psVar12;
      matches_text._M_dataplus._M_p = (pointer)*plVar8;
    }
    matches_text._M_string_length = plVar8[1];
    *plVar8 = (long)psVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)::std::__cxx11::string::append((char *)&matches_text);
    psVar13 = (size_t *)(plVar8 + 2);
    if ((size_t *)*plVar8 == psVar13) {
      clone.buflen = *psVar13;
      clone.prompt = (char *)plVar8[3];
      clone._0_8_ = &clone.buflen;
    }
    else {
      clone.buflen = *psVar13;
      clone._0_8_ = (size_t *)*plVar8;
    }
    clone.buf = (char *)plVar8[1];
    *plVar8 = (long)psVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&search_prompt,(string *)&clone);
    if ((size_t *)clone._0_8_ != &clone.buflen) {
      operator_delete((void *)clone._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)matches_text._M_dataplus._M_p != &matches_text.field_2) {
      operator_delete(matches_text._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)highlight_buffer._M_dataplus._M_p != &highlight_buffer.field_2) {
      operator_delete(highlight_buffer._M_dataplus._M_p);
    }
    ::std::__cxx11::string::_M_replace
              ((ulong)&no_matches_text,0,(char *)no_matches_text._M_string_length,0x12d8b69);
  }
  else {
    clone._0_8_ = &clone.buflen;
    clone.buf = (char *)0x0;
    clone.buflen = clone.buflen & 0xffffffffffffff00;
    matches_text._M_dataplus._M_p = (pointer)&matches_text.field_2;
    matches_text._M_string_length = 0;
    matches_text.field_2._M_allocated_capacity =
         matches_text.field_2._M_allocated_capacity & 0xffffffffffffff00;
    ::std::__cxx11::string::_M_append((char *)&clone,(ulong)(this->search_buf)._M_dataplus._M_p);
    if (uVar2 < uVar19) {
      uVar20 = this->search_index + 1;
      cVar16 = '\x01';
      if (9 < uVar20) {
        uVar14 = uVar20;
        cVar6 = '\x04';
        do {
          cVar16 = cVar6;
          if (uVar14 < 100) {
            cVar16 = cVar16 + -2;
            goto LAB_00224c72;
          }
          if (uVar14 < 1000) {
            cVar16 = cVar16 + -1;
            goto LAB_00224c72;
          }
          if (uVar14 < 10000) goto LAB_00224c72;
          bVar7 = 99999 < uVar14;
          uVar14 = uVar14 / 10000;
          cVar6 = cVar16 + '\x04';
        } while (bVar7);
        cVar16 = cVar16 + '\x01';
      }
LAB_00224c72:
      paVar1 = &highlight_buffer.field_2;
      highlight_buffer._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct((ulong)&highlight_buffer,cVar16);
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                (highlight_buffer._M_dataplus._M_p,(uint)highlight_buffer._M_string_length,uVar20);
      ::std::__cxx11::string::_M_append
                ((char *)&matches_text,(ulong)highlight_buffer._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)highlight_buffer._M_dataplus._M_p != paVar1) {
        operator_delete(highlight_buffer._M_dataplus._M_p);
      }
      uVar20 = ((long)(this->search_matches).
                      super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->search_matches).
                      super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      cVar16 = '\x01';
      if (9 < uVar20) {
        uVar14 = uVar20;
        cVar6 = '\x04';
        do {
          cVar16 = cVar6;
          if (uVar14 < 100) {
            cVar16 = cVar16 + -2;
            goto LAB_00224d2e;
          }
          if (uVar14 < 1000) {
            cVar16 = cVar16 + -1;
            goto LAB_00224d2e;
          }
          if (uVar14 < 10000) goto LAB_00224d2e;
          bVar7 = 99999 < uVar14;
          uVar14 = uVar14 / 10000;
          cVar6 = cVar16 + '\x04';
        } while (bVar7);
        cVar16 = cVar16 + '\x01';
      }
LAB_00224d2e:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&__str,cVar16);
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar20);
      plVar8 = (long *)::std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x135b7d1);
      psVar12 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar12) {
        highlight_buffer.field_2._M_allocated_capacity = *psVar12;
        highlight_buffer.field_2._8_8_ = plVar8[3];
        highlight_buffer._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        highlight_buffer.field_2._M_allocated_capacity = *psVar12;
        highlight_buffer._M_dataplus._M_p = (pointer)*plVar8;
      }
      highlight_buffer._M_string_length = plVar8[1];
      *plVar8 = (long)psVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)&matches_text,(ulong)highlight_buffer._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)highlight_buffer._M_dataplus._M_p != paVar1) {
        operator_delete(highlight_buffer._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p);
      }
    }
    sVar9 = ComputeRenderWidth((char *)clone._0_8_,(size_t)clone.buf);
    sVar10 = ComputeRenderWidth(matches_text._M_dataplus._M_p,matches_text._M_string_length);
    if (sVar9 + sVar10 < 0x1a) {
      ::std::__cxx11::string::_M_assign((string *)&search_prompt);
      highlight_buffer._M_dataplus._M_p = (pointer)&highlight_buffer.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&highlight_buffer,'\x1a' - (char)(sVar9 + sVar10))
      ;
      ::std::__cxx11::string::_M_append
                ((char *)&search_prompt,(ulong)highlight_buffer._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)highlight_buffer._M_dataplus._M_p != &highlight_buffer.field_2) {
        operator_delete(highlight_buffer._M_dataplus._M_p);
      }
      ::std::__cxx11::string::_M_append((char *)&search_prompt,(ulong)matches_text._M_dataplus._M_p)
      ;
      ::std::__cxx11::string::append((char *)&search_prompt);
    }
    else {
      uVar20 = 0x19 - sVar10;
      search_buf = (char *)clone._0_8_;
      search_len = (size_t)clone.buf;
      search_render_pos = 0;
      if (0x13 < sVar10) {
        uVar20 = 0x19;
      }
      highlight_buffer._M_string_length = 0;
      highlight_buffer.field_2._M_allocated_capacity =
           highlight_buffer.field_2._M_allocated_capacity & 0xffffffffffffff00;
      highlight_buffer._M_dataplus._M_p = (pointer)&highlight_buffer.field_2;
      renderText(&search_render_pos,&search_buf,&search_len,(size_t)clone.buf,uVar20,0,
                 &highlight_buffer,false,in_stack_fffffffffffffe58);
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&__str,search_buf,search_buf + search_len);
      ::std::__cxx11::string::operator=((string *)&search_prompt,(string *)&__str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p);
      }
      lVar15 = uVar20 - search_render_pos;
      if (search_render_pos <= uVar20 && lVar15 != 0) {
        do {
          ::std::__cxx11::string::append((char *)&search_prompt);
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      if (sVar10 < 0x14) {
        ::std::__cxx11::string::_M_append
                  ((char *)&search_prompt,(ulong)matches_text._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)&search_prompt);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)highlight_buffer._M_dataplus._M_p != &highlight_buffer.field_2) {
        operator_delete(highlight_buffer._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)matches_text._M_dataplus._M_p != &matches_text.field_2) {
      operator_delete(matches_text._M_dataplus._M_p);
    }
    if ((size_t *)clone._0_8_ != &clone.buflen) {
      operator_delete((void *)clone._0_8_);
    }
  }
  bVar7 = Highlighting::IsEnabled();
  pLVar17 = this;
  pLVar18 = &clone;
  for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
    iVar5 = pLVar17->ofd;
    pLVar18->ifd = pLVar17->ifd;
    pLVar18->ofd = iVar5;
    pLVar17 = (Linenoise *)((long)pLVar17 + (ulong)bVar21 * -0x10 + 8);
    pLVar18 = (Linenoise *)((long)pLVar18 + (ulong)bVar21 * -0x10 + 8);
  }
  clone.has_more_data = this->has_more_data;
  clone.insert = this->insert;
  clone.clear_screen = this->clear_screen;
  clone.continuation_markers = this->continuation_markers;
  clone.search = this->search;
  clone.render = this->render;
  paVar1 = &clone.search_buf.field_2;
  pcVar3 = (this->search_buf)._M_dataplus._M_p;
  clone.search_buf._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&clone.search_buf,pcVar3,pcVar3 + (this->search_buf)._M_string_length);
  ::std::vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>::vector
            (&clone.search_matches,&this->search_matches);
  clone.search_index = this->search_index;
  this->prompt = search_prompt._M_dataplus._M_p;
  this->plen = search_prompt._M_string_length;
  if ((uVar2 < uVar19) && ((this->search_buf)._M_string_length != 0)) {
    psVar4 = (this->search_matches).
             super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar9 = psVar4[clone.search_index].match_end;
    __s = History::GetEntry(psVar4[clone.search_index].history_index);
    this->buf = __s;
    sVar11 = strlen(__s);
    this->len = sVar11;
    this->pos = sVar9;
  }
  else {
    this->buf = no_matches_text._M_dataplus._M_p;
    this->len = no_matches_text._M_string_length;
    this->pos = 0;
    Highlighting::Disable();
  }
  RefreshLine(this);
  if (bVar7) {
    Highlighting::Enable();
  }
  this->buf = clone.buf;
  this->len = clone.len;
  this->prompt = clone.prompt;
  this->plen = clone.plen;
  this->pos = clone.pos;
  if (clone.search_matches.
      super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(clone.search_matches.
                    super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)clone.search_buf._M_dataplus._M_p != paVar1) {
    operator_delete(clone.search_buf._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)no_matches_text._M_dataplus._M_p != &no_matches_text.field_2) {
    operator_delete(no_matches_text._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)search_prompt._M_dataplus._M_p != &search_prompt.field_2) {
    operator_delete(search_prompt._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Linenoise::RefreshSearch() {
	std::string search_prompt;
	static const size_t SEARCH_PROMPT_RENDER_SIZE = 28;
	std::string no_matches_text = "(no matches)";
	bool no_matches = search_index >= search_matches.size();
	if (search_buf.empty()) {
		search_prompt = "search" + std::string(SEARCH_PROMPT_RENDER_SIZE - 8, ' ') + "> ";
		no_matches_text = "(type to search)";
	} else {
		std::string search_text;
		std::string matches_text;
		search_text += search_buf;
		if (!no_matches) {
			matches_text += std::to_string(search_index + 1);
			matches_text += "/" + std::to_string(search_matches.size());
		}
		size_t search_text_length = ComputeRenderWidth(search_text.c_str(), search_text.size());
		size_t matches_text_length = ComputeRenderWidth(matches_text.c_str(), matches_text.size());
		size_t total_text_length = search_text_length + matches_text_length;
		if (total_text_length < SEARCH_PROMPT_RENDER_SIZE - 2) {
			// search text is short: we can render the entire search text
			search_prompt = search_text;
			search_prompt += std::string(SEARCH_PROMPT_RENDER_SIZE - 2 - total_text_length, ' ');
			search_prompt += matches_text;
			search_prompt += "> ";
		} else {
			// search text length is too long to fit: truncate
			bool render_matches = matches_text_length < SEARCH_PROMPT_RENDER_SIZE - 8;
			char *search_buf = (char *)search_text.c_str();
			size_t search_len = search_text.size();
			size_t search_render_pos = 0;
			size_t max_render_size = SEARCH_PROMPT_RENDER_SIZE - 3;
			if (render_matches) {
				max_render_size -= matches_text_length;
			}
			std::string highlight_buffer;
			renderText(search_render_pos, search_buf, search_len, search_len, max_render_size, 0, highlight_buffer,
			           false);
			search_prompt = std::string(search_buf, search_len);
			for (size_t i = search_render_pos; i < max_render_size; i++) {
				search_prompt += " ";
			}
			if (render_matches) {
				search_prompt += matches_text;
			}
			search_prompt += "> ";
		}
	}
	auto oldHighlighting = Highlighting::IsEnabled();
	Linenoise clone = *this;
	prompt = search_prompt.c_str();
	plen = search_prompt.size();
	if (no_matches || search_buf.empty()) {
		// if there are no matches render the no_matches_text
		buf = (char *)no_matches_text.c_str();
		len = no_matches_text.size();
		pos = 0;
		// don't highlight the "no_matches" text
		Highlighting::Disable();
	} else {
		// if there are matches render the current history item
		auto search_match = search_matches[search_index];
		auto history_index = search_match.history_index;
		auto cursor_position = search_match.match_end;
		buf = (char *)History::GetEntry(history_index);
		len = strlen(buf);
		pos = cursor_position;
	}
	RefreshLine();

	if (oldHighlighting) {
		Highlighting::Enable();
	}
	buf = clone.buf;
	len = clone.len;
	pos = clone.pos;
	prompt = clone.prompt;
	plen = clone.plen;
}